

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O2

Texture __thiscall
Rml::CallbackTextureSource::GetTexture(CallbackTextureSource *this,RenderManager *render_manager)

{
  UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  *this_00;
  Texture TVar1;
  undefined1 local_50 [48];
  
  local_50._0_8_ = render_manager;
  this_00 = &itlib::
             flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
             ::operator[]<Rml::RenderManager*>
                       ((flat_map<Rml::RenderManager*,Rml::CallbackTexture,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderManager*,Rml::CallbackTexture>,std::allocator<std::pair<Rml::RenderManager*,Rml::CallbackTexture>>>>
                         *)&this->textures,(RenderManager **)local_50)->
             super_UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ;
  if (this_00->resource_handle == Invalid) {
    ::std::function<bool_(const_Rml::CallbackTextureInterface_&)>::function
              ((function<bool_(const_Rml::CallbackTextureInterface_&)> *)(local_50 + 0x10),
               &this->callback);
    RenderManager::MakeCallbackTexture
              ((RenderManager *)local_50,(CallbackTextureFunction *)render_manager);
    UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::operator=(this_00,(UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                         *)local_50);
    UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ::~UniqueRenderResource
              ((UniqueRenderResource<Rml::CallbackTexture,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                *)local_50);
    ::std::_Function_base::~_Function_base((_Function_base *)(local_50 + 0x10));
  }
  TVar1 = CallbackTexture::operator_cast_to_Texture((CallbackTexture *)this_00);
  return TVar1;
}

Assistant:

Texture CallbackTextureSource::GetTexture(RenderManager& render_manager) const
{
	CallbackTexture& texture = textures[&render_manager];
	if (!texture)
		texture = render_manager.MakeCallbackTexture(callback);
	return Texture(texture);
}